

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TracerouteRunner *this;
  pointer pbVar5;
  bool bVar6;
  thread t2;
  thread t1;
  TracerouteRunner *t;
  parser locate_route;
  string url;
  thread local_2a8;
  thread local_2a0;
  TracerouteRunner *local_298;
  code *local_290;
  undefined8 local_288;
  parser local_280;
  string local_1a0;
  byte abStack_180 [88];
  ios_base local_128 [264];
  
  argh::parser::parser(&local_280,argc,argv,1);
  paVar1 = &local_1a0.field_2;
  local_1a0._M_dataplus._M_p = "-h";
  local_1a0._M_string_length = 0x12e007;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::
              __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_pred<argh::parser::operator[](std::initializer_list<char_const*const>)const::_lambda(char_const*)_1_>>
                        (&local_1a0,paVar1,&local_280);
  if (paVar4 == paVar1) {
    if ((ulong)((long)local_280.pos_args_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_280.pos_args_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      std::__cxx11::istringstream::istringstream((istringstream *)&local_1a0);
      std::ios::clear((int)&local_2a8 + (int)*(undefined8 *)(local_1a0._M_dataplus._M_p + -0x18) +
                      0x108);
    }
    else {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&local_1a0,
                 (string *)
                 (local_280.pos_args_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1),_S_in);
    }
    bVar2 = abStack_180[*(long *)(local_1a0._M_dataplus._M_p + -0x18)];
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1a0);
    std::ios_base::~ios_base(local_128);
    if ((bVar2 & 5) == 0) {
      bVar6 = (ulong)((long)local_280.pos_args_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_280.pos_args_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x21;
      pbVar5 = local_280.pos_args_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      if (bVar6) {
        pbVar5 = &local_280.empty_;
      }
      local_1a0._M_dataplus._M_p = (pointer)paVar1;
      pcVar3 = (pbVar5->_M_dataplus)._M_p;
      pbVar5 = &local_280.empty_;
      if (!bVar6) {
        pbVar5 = local_280.pos_args_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,pcVar3,pcVar3 + pbVar5->_M_string_length);
      this = (TracerouteRunner *)operator_new(0x68);
      TracerouteRunner::TracerouteRunner(this,&local_1a0);
      local_290 = TracerouteRunner::fetch_results;
      local_288 = 0;
      local_298 = this;
      std::thread::thread<void(TracerouteRunner::*)(),TracerouteRunner*&,void>
                (&local_2a0,(offset_in_TracerouteRunner_to_subr *)&local_290,&local_298);
      local_290 = TracerouteRunner::print_output;
      local_288 = 0;
      std::thread::thread<void(TracerouteRunner::*)(),TracerouteRunner*&,void>
                (&local_2a8,(offset_in_TracerouteRunner_to_subr *)&local_290,&local_298);
      std::thread::join();
      std::thread::join();
      if ((local_2a8._M_id._M_thread != 0) || (local_2a0._M_id._M_thread != 0)) {
        std::terminate();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Enter ip address or domain name",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "locateroute - Get location information of the traceroute hops\n\n",0x3f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"USAGE: \n\t locateroute [ip or domain name]\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"FLAGS: \n\t -h, --help  Display Help\n",0x23);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.empty_._M_dataplus._M_p != &local_280.empty_.field_2) {
    operator_delete(local_280.empty_._M_dataplus._M_p,
                    local_280.empty_.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_280.registeredParams_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_280.flags_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280.pos_args_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_280.params_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_280.args_);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

	argh::parser locate_route(argc, argv);

	if(locate_route[{"-h", "--help"}]) {
		std::cout << "locateroute - Get location information of the traceroute hops\n\n";
		std::cout << "USAGE: \n\t locateroute [ip or domain name]\n";
		std::cout << "FLAGS: \n\t -h, --help  Display Help\n";
	} else {
		if(locate_route(1)) {
			std::string url = locate_route[1];
			auto *t = new TracerouteRunner(url);

			std::thread t1(&TracerouteRunner::fetch_results, t);
			std::thread t2(&TracerouteRunner::print_output, t);

			t1.join();
			t2.join();
		} else {
			std::cout << "Enter ip address or domain name" << std::endl;
		}
	}

	return 0;
}